

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-ui-imgui.cc
# Opt level: O0

void __thiscall HostUI::init_font(HostUI *this)

{
  int local_28;
  int local_24;
  int height;
  int width;
  uchar *pixels;
  ImGuiIO *io;
  HostUI *this_local;
  
  io = (ImGuiIO *)this;
  pixels = (uchar *)ImGui::GetIO();
  ImFontAtlas::GetTexDataAsRGBA32
            (((ImGuiIO *)pixels)->Fonts,(uchar **)&height,&local_24,&local_28,(int *)0x0);
  glGenTextures(1,&this->font_texture);
  glBindTexture(0xde1,this->font_texture);
  glTexParameteri(0xde1,0x2801,0x2601);
  glTexParameteri(0xde1,0x2800,0x2601);
  glPixelStorei(0xcf2,0);
  glTexImage2D(0xde1,0,0x1908,local_24,local_28,0,0x1908,0x1401,_height);
  *(ulong *)(*(long *)(pixels + 0xa0) + 8) = (ulong)this->font_texture;
  return;
}

Assistant:

void HostUI::init_font() {
  ImGuiIO& io = ImGui::GetIO();

  // Load as RGBA 32-bits for OpenGL3 demo because it is more likely to be
  // compatible with user's existing shader.
  unsigned char* pixels;
  int width, height;
  io.Fonts->GetTexDataAsRGBA32(&pixels, &width, &height);

  // Upload texture to graphics system
  glGenTextures(1, &font_texture);
  glBindTexture(GL_TEXTURE_2D, font_texture);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
  glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
  glPixelStorei(GL_UNPACK_ROW_LENGTH, 0);
  glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, width, height, 0, GL_RGBA,
               GL_UNSIGNED_BYTE, pixels);

  // Store our identifier
  io.Fonts->TexID = (void*)(intptr_t)font_texture;
}